

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

void cJSON_InitHooks(cJSON_Hooks *hooks)

{
  code *pcVar1;
  
  if (hooks == (cJSON_Hooks *)0x0) {
    cJSON_malloc = malloc;
  }
  else {
    pcVar1 = hooks->malloc_fn;
    if (pcVar1 == (_func_void_ptr_size_t *)0x0) {
      pcVar1 = malloc;
    }
    cJSON_malloc = pcVar1;
    if (hooks->free_fn != (_func_void_void_ptr *)0x0) {
      cJSON_free = hooks->free_fn;
      return;
    }
  }
  cJSON_free = free;
  return;
}

Assistant:

void cJSON_InitHooks(cJSON_Hooks* hooks)
{
    if (!hooks) { /* Reset hooks */
        cJSON_malloc = malloc;
        cJSON_free = free;
        return;
    }

	cJSON_malloc = (hooks->malloc_fn)?hooks->malloc_fn:malloc;
	cJSON_free	 = (hooks->free_fn)?hooks->free_fn:free;
}